

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxRandom::Emit(FxRandom *this,VMFunctionBuilder *build)

{
  FScriptPosition *pos;
  _func_int **ptr;
  PClass *pPVar1;
  int iVar2;
  uint uVar3;
  PSymbol *pPVar4;
  undefined4 extraout_var;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  FName local_2c;
  PClass *pPVar5;
  
  local_2c.Index = 0x23f;
  pPVar4 = FindBuiltinFunction(&local_2c,BuiltinRandom);
  pPVar1 = PSymbolVMFunction::RegistrationInfo.MyClass;
  pPVar5 = (pPVar4->super_PTypeBase).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar2 = (**(pPVar4->super_PTypeBase).super_DObject._vptr_DObject)(pPVar4);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
    (pPVar4->super_PTypeBase).super_DObject.Class = pPVar5;
  }
  bVar9 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar1 && bVar9) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar9 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar1) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (!bVar9) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x141a,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
  }
  ptr = pPVar4[1].super_PTypeBase.super_DObject._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar9 = this->EmitTail;
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,this->rng,'\x02');
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar3);
    iVar2 = 1;
    if ((this->min != (FxExpression *)0x0) && (this->max != (FxExpression *)0x0)) {
      pos = &(this->super_FxExpression).ScriptPosition;
      EmitParameter(build,this->min,pos);
      EmitParameter(build,this->max,pos);
      iVar2 = 3;
    }
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar9 + (uint)bVar9 * 2 + 0x49,uVar3,iVar2,1);
    if (this->EmitTail == false) {
      uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      uVar7 = (ulong)(uVar3 & 0xffff);
      uVar8 = 0;
      VMFunctionBuilder::Emit(build,0x4d,0,0,uVar3 & 0xffff);
      uVar6 = 0x1000000;
    }
    else {
      uVar8 = 0x800000;
      uVar6 = 0x1000001000000;
      uVar7 = 0;
    }
    return (ExpEmit)(uVar6 | uVar8 | uVar7);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x141b,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom::Emit(VMFunctionBuilder *build)
{
	// Call DecoRandom to generate a random number.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinRandom, BuiltinRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != nullptr && max != nullptr)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}